

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knownhost.c
# Opt level: O0

int hashed_hostline(LIBSSH2_KNOWNHOSTS *hosts,char *host,size_t hostlen,char *key_type_name,
                   size_t key_type_len,char *key,size_t keylen,int key_type,char *comment,
                   size_t commentlen)

{
  char *__src;
  ulong uVar1;
  bool bVar2;
  size_t saltlen;
  char *hash;
  char *salt;
  char hostbuf [256];
  char saltbuf [32];
  char *p;
  char *key_local;
  size_t key_type_len_local;
  char *key_type_name_local;
  size_t hostlen_local;
  char *host_local;
  LIBSSH2_KNOWNHOSTS *hosts_local;
  
  __src = host + 3;
  saltbuf._24_8_ = __src;
  while( true ) {
    bVar2 = false;
    if (*(char *)saltbuf._24_8_ != '\0') {
      bVar2 = *(char *)saltbuf._24_8_ != '|';
    }
    if (!bVar2) break;
    saltbuf._24_8_ = saltbuf._24_8_ + 1;
  }
  if (*(char *)saltbuf._24_8_ == '|') {
    uVar1 = saltbuf._24_8_ - (long)__src;
    if (uVar1 < 0x1f) {
      memcpy(hostbuf + 0xf8,__src,uVar1);
      hostbuf[uVar1 + 0xf8] = '\0';
      uVar1 = (hostlen - 3) - (uVar1 + 1);
      if (uVar1 < 0xff) {
        memcpy(&salt,(void *)(saltbuf._24_8_ + 1),uVar1);
        *(undefined1 *)((long)&hash + uVar1 + 8) = 0;
        hosts_local._4_4_ =
             knownhost_add(hosts,(char *)&salt,hostbuf + 0xf8,key_type_name,key_type_len,key,keylen,
                           comment,commentlen,key_type | 0x20002,(libssh2_knownhost **)0x0);
      }
      else {
        hosts_local._4_4_ =
             _libssh2_error(hosts->session,-0x21,
                            "Failed to parse known_hosts line (unexpected length)");
      }
    }
    else {
      hosts_local._4_4_ =
           _libssh2_error(hosts->session,-0x21,
                          "Failed to parse known_hosts line (unexpectedly long salt)");
    }
  }
  else {
    hosts_local._4_4_ = 0;
  }
  return hosts_local._4_4_;
}

Assistant:

static int hashed_hostline(LIBSSH2_KNOWNHOSTS *hosts,
                           const char *host, size_t hostlen,
                           const char *key_type_name, size_t key_type_len,
                           const char *key, size_t keylen, int key_type,
                           const char *comment, size_t commentlen)
{
    const char *p;
    char saltbuf[32];
    char hostbuf[256];

    const char *salt = &host[3]; /* skip the magic marker */
    hostlen -= 3;    /* deduct the marker */

    /* this is where the salt starts, find the end of it */
    for(p = salt; *p && (*p != '|'); p++)
        ;

    if(*p == '|') {
        const char *hash = NULL;
        size_t saltlen = p - salt;
        if(saltlen >= (sizeof(saltbuf)-1)) /* weird length */
            return _libssh2_error(hosts->session,
                                  LIBSSH2_ERROR_METHOD_NOT_SUPPORTED,
                                  "Failed to parse known_hosts line "
                                  "(unexpectedly long salt)");

        memcpy(saltbuf, salt, saltlen);
        saltbuf[saltlen] = 0; /* zero terminate */
        salt = saltbuf; /* point to the stack based buffer */

        hash = p + 1; /* the host hash is after the separator */

        /* now make the host point to the hash */
        host = hash;
        hostlen -= saltlen + 1; /* deduct the salt and separator */

        /* check that the lengths seem sensible */
        if(hostlen >= sizeof(hostbuf)-1)
            return _libssh2_error(hosts->session,
                                  LIBSSH2_ERROR_METHOD_NOT_SUPPORTED,
                                  "Failed to parse known_hosts line "
                                  "(unexpected length)");

        memcpy(hostbuf, host, hostlen);
        hostbuf[hostlen] = 0;

        return knownhost_add(hosts, hostbuf, salt,
                             key_type_name, key_type_len,
                             key, keylen,
                             comment, commentlen,
                             key_type | LIBSSH2_KNOWNHOST_TYPE_SHA1 |
                             LIBSSH2_KNOWNHOST_KEYENC_BASE64, NULL);
    }
    else
        return 0; /* XXX: This should be an error, shouldn't it? */
}